

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O3

wchar_t * noedit_wgets(EditLine *el,wchar_t *nread)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  int *piVar3;
  wchar_t *pwVar4;
  
  pwVar4 = (el->el_line).lastchar;
  do {
    wVar1 = (*el->el_read->read_char)(el,pwVar4);
    if (wVar1 != L'\x01') {
      if (wVar1 == L'\xffffffff') {
        piVar3 = __errno_location();
        pwVar4 = (el->el_line).buffer;
        if (*piVar3 == 4) {
          (el->el_line).lastchar = pwVar4;
        }
        goto LAB_0011d31e;
      }
      goto LAB_0011d31a;
    }
    pwVar2 = (el->el_line).lastchar;
    if ((el->el_line).limit <= pwVar2 + 1) {
      wVar1 = ch_enlargebufs(el,2);
      if (wVar1 == L'\0') {
LAB_0011d31a:
        pwVar4 = (el->el_line).buffer;
LAB_0011d31e:
        pwVar2 = (el->el_line).lastchar;
        (el->el_line).cursor = pwVar2;
        *pwVar2 = L'\0';
        wVar1 = (wchar_t)((ulong)((long)pwVar2 - (long)pwVar4) >> 2);
        *nread = wVar1;
        pwVar2 = (wchar_t *)0x0;
        if (wVar1 != L'\0') {
          pwVar2 = pwVar4;
        }
        return pwVar2;
      }
      pwVar2 = (el->el_line).lastchar;
    }
    pwVar4 = pwVar2 + 1;
    (el->el_line).lastchar = pwVar4;
    if ((((el->el_flags & L'\b') != L'\0') || (*pwVar2 == L'\n')) || (*pwVar2 == L'\r'))
    goto LAB_0011d31a;
  } while( true );
}

Assistant:

static const wchar_t *
noedit_wgets(EditLine *el, int *nread)
{
	el_line_t	*lp = &el->el_line;
	int		 num;

	while ((num = (*el->el_read->read_char)(el, lp->lastchar)) == 1) {
		if (lp->lastchar + 1 >= lp->limit &&
		    !ch_enlargebufs(el, (size_t)2))
			break;
		lp->lastchar++;
		if (el->el_flags & UNBUFFERED ||
		    lp->lastchar[-1] == '\r' ||
		    lp->lastchar[-1] == '\n')
			break;
	}
	if (num == -1 && errno == EINTR)
		lp->lastchar = lp->buffer;
	lp->cursor = lp->lastchar;
	*lp->lastchar = '\0';
	*nread = (int)(lp->lastchar - lp->buffer);
	return *nread ? lp->buffer : NULL;
}